

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O0

void * align_malloc(int i_size)

{
  void *pvVar1;
  u8 *buf;
  u8 *align_buf;
  int mask;
  int i_size_local;
  
  buf = (u8 *)0x0;
  pvVar1 = malloc((long)(i_size + 0x1f) + 8);
  if (pvVar1 != (void *)0x0) {
    buf = (u8 *)(((long)pvVar1 + 0x27U) - ((long)pvVar1 + 0x27U & 0x1f));
    *(void **)(buf + -8) = pvVar1;
    memset(buf,0,(long)i_size);
  }
  return buf;
}

Assistant:

void *align_malloc(int i_size)
{
    int mask = ALIGN_BASIC - 1;
    u8 *align_buf = NULL;
    u8 *buf = (u8 *)malloc(i_size + mask + sizeof(void **));
    
    if (buf) {
        align_buf = buf + mask + sizeof(void **);
        align_buf -= (intptr_t)align_buf & mask;
        *(((void **)align_buf) - 1) = buf;
        memset(align_buf, 0, i_size);
    } 
    return align_buf;
}